

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O1

void __thiscall
xray_re::xr_mesh_vbuf::extend<xray_re::_vector2<float>>
          (xr_mesh_vbuf *this,_vector2<float> **source,size_t new_size)

{
  _vector2<float> *__src;
  size_t sVar1;
  _vector2<float> *__dest;
  
  __dest = (_vector2<float> *)operator_new__(-(ulong)(new_size >> 0x3d != 0) | new_size * 8);
  __src = *source;
  if (__src != (_vector2<float> *)0x0) {
    sVar1 = (this->super_xr_vbuf).super_xr_flexbuf.m_size;
    if (sVar1 != 0) {
      memmove(__dest,__src,sVar1 << 3);
    }
    if (__src != (_vector2<float> *)0x0) {
      operator_delete(__src,8);
    }
  }
  *source = __dest;
  return;
}

Assistant:

void xr_mesh_vbuf::extend(T*& source, size_t new_size)
{
	T* target = new T[new_size];
	if (source)
		copy(source, target, size());
	delete source;
	source = target;
}